

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall pbrt::StatsAccumulator::Print(StatsAccumulator *this,FILE *dest)

{
  Stats *pSVar1;
  long lVar2;
  _Base_ptr p_Var3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar4;
  _Base_ptr p_Var5;
  size_t sVar6;
  _Rb_tree_node_base *p_Var7;
  size_t bytes;
  size_t bytes_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  void *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  string category;
  string title;
  int64_t denom;
  double local_b8;
  string local_b0;
  double avg;
  long local_70;
  _Rb_tree_node_base *local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  toPrint;
  
  fwrite("Statistics:\n",0xc,1,(FILE *)dest);
  toPrint._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &toPrint._M_t._M_impl.super__Rb_tree_header._M_header;
  toPrint._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  toPrint._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  toPrint._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar1 = this->stats;
  toPrint._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       toPrint._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var5 = (pSVar1->counters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pSVar1->counters)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    if (*(long *)(p_Var5 + 2) != 0) {
      category._M_dataplus._M_p = (pointer)&category.field_2;
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&title.field_2;
      category._M_string_length = 0;
      title._M_string_length = 0;
      category.field_2._M_local_buf[0] = '\0';
      title.field_2._M_local_buf[0] = '\0';
      title._M_dataplus._M_p = (pointer)in_R8;
      getCategoryAndTitle((string *)(p_Var5 + 1),&category,&title);
      pvVar4 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&toPrint,&category);
      StringPrintf<std::__cxx11::string&,long&>
                (&local_b0,(pbrt *)"%-42s               %12lu",(char *)&title,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var5 + 2),
                 (long *)in_R8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar4,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&title);
      std::__cxx11::string::~string((string *)&category);
    }
  }
  local_70 = 0;
  local_68 = &(this->stats->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var5 = (this->stats->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 != local_68; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    lVar2 = *(long *)(p_Var5 + 2);
    if (lVar2 != 0) {
      category._M_dataplus._M_p = (pointer)&category.field_2;
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&title.field_2;
      category._M_string_length = 0;
      title._M_string_length = 0;
      category.field_2._M_local_buf[0] = '\0';
      title.field_2._M_local_buf[0] = '\0';
      title._M_dataplus._M_p = (pointer)in_R8;
      getCategoryAndTitle((string *)(p_Var5 + 1),&category,&title);
      pvVar4 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&toPrint,&category);
      Print(_IO_FILE*)::$_0::operator()[abi_cxx11_((string *)&avg,*(void **)(p_Var5 + 2),bytes);
      StringPrintf<std::__cxx11::string&,std::__cxx11::string>
                (&local_b0,(pbrt *)"%-42s                  %s",(char *)&title,(string *)&avg,in_R8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar4,&local_b0);
      local_70 = local_70 + lVar2;
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&avg);
      std::__cxx11::string::~string((string *)&title);
      std::__cxx11::string::~string((string *)&category);
    }
  }
  sVar6 = GetCurrentRSS();
  this_00 = (void *)(sVar6 - local_70);
  if (0 < (long)this_00) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&category,"Memory",(allocator<char> *)&avg);
    pvVar4 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&toPrint,&category);
    Print(_IO_FILE*)::$_0::operator()[abi_cxx11_(&local_b0,this_00,bytes_00);
    StringPrintf<char_const(&)[20],std::__cxx11::string>
              (&title,(pbrt *)"%-42s                  %s","Unreported / unused",
               (char (*) [20])&local_b0,in_R8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(pvVar4,&title);
    std::__cxx11::string::~string((string *)&title);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&category);
  }
  pSVar1 = this->stats;
  for (p_Var5 = (pSVar1->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pSVar1->intDistributions)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    if (*(long *)(p_Var5 + 2) != 0) {
      category._M_dataplus._M_p = (pointer)&category.field_2;
      title._M_dataplus._M_p = (pointer)&title.field_2;
      category._M_string_length = 0;
      title._M_string_length = 0;
      category.field_2._M_local_buf[0] = '\0';
      title.field_2._M_local_buf[0] = '\0';
      getCategoryAndTitle((string *)(p_Var5 + 1),&category,&title);
      avg = (double)(long)p_Var5[2]._M_right / (double)*(long *)(p_Var5 + 2);
      pvVar4 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&toPrint,&category);
      StringPrintf<std::__cxx11::string&,double&,long&,long&>
                (&local_b0,(pbrt *)"%-42s                      %.3f avg [range %lu - %lu]",
                 (char *)&title,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&avg,
                 (double *)&p_Var5[2]._M_parent,(long *)&p_Var5[2]._M_left,
                 (long *)category._M_dataplus._M_p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar4,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&title);
      std::__cxx11::string::~string((string *)&category);
    }
  }
  pSVar1 = this->stats;
  for (p_Var5 = (pSVar1->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pSVar1->floatDistributions)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    if (*(long *)(p_Var5 + 2) != 0) {
      category._M_dataplus._M_p = (pointer)&category.field_2;
      title._M_dataplus._M_p = (pointer)&title.field_2;
      category._M_string_length = 0;
      title._M_string_length = 0;
      category.field_2._M_local_buf[0] = '\0';
      title.field_2._M_local_buf[0] = '\0';
      getCategoryAndTitle((string *)(p_Var5 + 1),&category,&title);
      avg = (double)p_Var5[2]._M_right / (double)*(long *)(p_Var5 + 2);
      pvVar4 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&toPrint,&category);
      StringPrintf<std::__cxx11::string&,double&,double&,double&>
                (&local_b0,(pbrt *)"%-42s                      %.3f avg [range %f - %f]",
                 (char *)&title,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&avg,
                 (double *)&p_Var5[2]._M_parent,(double *)&p_Var5[2]._M_left,
                 (double *)category._M_dataplus._M_p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar4,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&title);
      std::__cxx11::string::~string((string *)&category);
    }
  }
  pSVar1 = this->stats;
  for (p_Var5 = (pSVar1->percentages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pSVar1->percentages)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    if (p_Var5[2]._M_parent != (_Base_ptr)0x0) {
      category._M_dataplus._M_p = (pointer)&category.field_2;
      title._M_dataplus._M_p = (pointer)&title.field_2;
      avg = *(double *)(p_Var5 + 2);
      category._M_string_length = 0;
      title._M_string_length = 0;
      category.field_2._M_local_buf[0] = '\0';
      title.field_2._M_local_buf[0] = '\0';
      denom = (int64_t)p_Var5[2]._M_parent;
      getCategoryAndTitle((string *)(p_Var5 + 1),&category,&title);
      pvVar4 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&toPrint,&category);
      local_b8 = (double)CONCAT44(local_b8._4_4_,((float)(long)avg * 100.0) / (float)denom);
      StringPrintf<std::__cxx11::string&,long&,long&,float>
                (&local_b0,(pbrt *)"%-42s%12lu / %12lu (%.2f%%)",(char *)&title,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&avg,&denom,
                 (long *)&local_b8,(float *)category._M_dataplus._M_p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar4,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&title);
      std::__cxx11::string::~string((string *)&category);
    }
  }
  pSVar1 = this->stats;
  for (p_Var5 = (pSVar1->ratios)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = toPrint._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      (_Rb_tree_header *)p_Var5 != &(pSVar1->ratios)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    if (p_Var5[2]._M_parent != (_Base_ptr)0x0) {
      category._M_dataplus._M_p = (pointer)&category.field_2;
      title._M_dataplus._M_p = (pointer)&title.field_2;
      avg = *(double *)(p_Var5 + 2);
      category._M_string_length = 0;
      title._M_string_length = 0;
      category.field_2._M_local_buf[0] = '\0';
      title.field_2._M_local_buf[0] = '\0';
      denom = (int64_t)p_Var5[2]._M_parent;
      getCategoryAndTitle((string *)(p_Var5 + 1),&category,&title);
      pvVar4 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&toPrint,&category);
      local_b8 = (double)(long)avg / (double)denom;
      StringPrintf<std::__cxx11::string&,long&,long&,double>
                (&local_b0,(pbrt *)"%-42s%12lu / %12lu (%.2fx)",(char *)&title,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&avg,&denom,
                 (long *)&local_b8,(double *)category._M_dataplus._M_p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar4,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&title);
      std::__cxx11::string::~string((string *)&category);
    }
  }
  for (; (_Rb_tree_header *)p_Var7 != &toPrint._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    fprintf((FILE *)dest,"  %s\n",*(undefined8 *)(p_Var7 + 1));
    p_Var3 = p_Var7[2]._M_parent;
    for (p_Var5 = *(_Base_ptr *)(p_Var7 + 2); p_Var5 != p_Var3; p_Var5 = p_Var5 + 1) {
      fprintf((FILE *)dest,"    %s\n",*(undefined8 *)p_Var5);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&toPrint._M_t);
  return;
}

Assistant:

void StatsAccumulator::Print(FILE *dest) {
    fprintf(dest, "Statistics:\n");
    std::map<std::string, std::vector<std::string>> toPrint;

    for (auto &counter : stats->counters) {
        if (counter.second == 0)
            continue;
        std::string category, title;
        getCategoryAndTitle(counter.first, &category, &title);
        toPrint[category].push_back(
            StringPrintf("%-42s               %12" PRIu64, title, counter.second));
    }

    size_t totalMemoryReported = 0;
    auto printBytes = [](size_t bytes) -> std::string {
        float kb = (double)bytes / 1024.;
        if (std::abs(kb) < 1024.)
            return StringPrintf("%9.2f kB", kb);

        float mib = kb / 1024.;
        if (std::abs(mib) < 1024.)
            return StringPrintf("%9.2f MiB", mib);

        float gib = mib / 1024.;
        return StringPrintf("%9.2f GiB", gib);
    };

    for (auto &counter : stats->memoryCounters) {
        if (counter.second == 0)
            continue;
        totalMemoryReported += counter.second;

        std::string category, title;
        getCategoryAndTitle(counter.first, &category, &title);
        toPrint[category].push_back(
            StringPrintf("%-42s                  %s", title, printBytes(counter.second)));
    }
    int64_t unreportedBytes = GetCurrentRSS() - totalMemoryReported;
    if (unreportedBytes > 0)
        toPrint["Memory"].push_back(StringPrintf("%-42s                  %s",
                                                 "Unreported / unused",
                                                 printBytes(unreportedBytes)));

    for (auto &distrib : stats->intDistributions) {
        const std::string &name = distrib.first;
        if (distrib.second.count == 0)
            continue;
        std::string category, title;
        getCategoryAndTitle(name, &category, &title);
        double avg = (double)distrib.second.sum / (double)distrib.second.count;
        toPrint[category].push_back(StringPrintf(
            "%-42s                      %.3f avg [range %" PRIu64 " - %" PRIu64 "]",
            title, avg, distrib.second.min, distrib.second.max));
    }
    for (auto &distrib : stats->floatDistributions) {
        const std::string &name = distrib.first;
        if (distrib.second.count == 0)
            continue;
        std::string category, title;
        getCategoryAndTitle(name, &category, &title);
        double avg = (double)distrib.second.sum / (double)distrib.second.count;
        toPrint[category].push_back(
            StringPrintf("%-42s                      %.3f avg [range %f - %f]", title,
                         avg, distrib.second.min, distrib.second.max));
    }
    for (auto &percentage : stats->percentages) {
        if (percentage.second.second == 0)
            continue;
        int64_t num = percentage.second.first;
        int64_t denom = percentage.second.second;
        std::string category, title;
        getCategoryAndTitle(percentage.first, &category, &title);
        toPrint[category].push_back(
            StringPrintf("%-42s%12" PRIu64 " / %12" PRIu64 " (%.2f%%)", title, num, denom,
                         (100.f * num) / denom));
    }
    for (auto &ratio : stats->ratios) {
        if (ratio.second.second == 0)
            continue;
        int64_t num = ratio.second.first;
        int64_t denom = ratio.second.second;
        std::string category, title;
        getCategoryAndTitle(ratio.first, &category, &title);
        toPrint[category].push_back(
            StringPrintf("%-42s%12" PRIu64 " / %12" PRIu64 " (%.2fx)", title, num, denom,
                         (double)num / (double)denom));
    }

    for (auto &categories : toPrint) {
        fprintf(dest, "  %s\n", categories.first.c_str());
        for (auto &item : categories.second)
            fprintf(dest, "    %s\n", item.c_str());
    }
}